

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O2

BOOL __thiscall
Js::TypedArray<int,_false,_false>::DirectSetItemAtRange
          (TypedArray<int,_false,_false> *this,int32 start,uint32 length,int typedValue)

{
  uint uVar1;
  Type puVar2;
  code *pcVar3;
  uint uVar4;
  bool bVar5;
  BOOL BVar6;
  uint32 uVar7;
  undefined4 *puVar8;
  ulong uVar9;
  BOOL BVar10;
  
  BVar6 = CrossSite::IsCrossSiteObjectTyped<Js::TypedArray<int,false,false>>(this);
  BVar10 = 0;
  if (BVar6 == 0) {
    if (((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached == true)
    {
      JavascriptError::ThrowTypeError
                ((((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                     super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
    }
    BVar10 = 1;
    if (start < 0) {
      if ((long)((long)start + (ulong)length) < 0) {
        return 1;
      }
      length = length + start;
      start = 0;
    }
    if ((uint)start < (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length)
    {
      uVar7 = UInt32Math::Add(start,length);
      uVar1 = (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
      uVar4 = uVar1 - start;
      if (uVar7 <= uVar1) {
        uVar4 = length;
      }
      uVar9 = (ulong)uVar4;
      puVar2 = (this->super_TypedArrayBase).buffer;
      if (typedValue == 0) {
        if (uVar9 * 4 < uVar9) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                      ,0x1ab,"(byteSize >= newLength)","byteSize >= newLength");
          if (!bVar5) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar8 = 0;
        }
        memset(puVar2 + (ulong)(uint)start * 4,0,uVar9 * 4);
      }
      else {
        while (bVar5 = uVar9 != 0, uVar9 = uVar9 - 1, bVar5) {
          *(int *)(puVar2 + (ulong)(uint)start * 4) = typedValue;
          start = start + 1;
        }
      }
    }
  }
  return BVar10;
}

Assistant:

inline BOOL DirectSetItemAtRange(__in int32 start, __in uint32 length, __in TypeName typedValue)
        {
            if (CrossSite::IsCrossSiteObjectTyped(this))
            {
                return false;
            }

            if (this->IsDetachedBuffer()) // 9.4.5.9 IntegerIndexedElementSet
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }
            uint32 newStart = start, newLength = length;

            if (start < 0)
            {
                if ((int64)(length) + start < 0)
                {
                    // nothing to do, all index are no-op
                    return true;
                }
                newStart = 0;
                // fixup the length with the change
                newLength += start;
            }
            if (newStart >= GetLength())
            {
                // If we want to start copying past the length of the array, all index are no-op
                return true;
            }
            if (UInt32Math::Add(newStart, newLength) > GetLength())
            {
                newLength = GetLength() - newStart;
            }

            TypeName* typedBuffer = (TypeName*)buffer;

            if (typedValue == 0 || sizeof(TypeName) == 1)
            {
                const size_t byteSize = sizeof(TypeName) * newLength;
                Assert(byteSize >= newLength); // check for overflow
                memset(typedBuffer + newStart, (int)typedValue, byteSize);
            }
            else
            {
                for (uint32 i = 0; i < newLength; i++)
                {
                    typedBuffer[newStart + i] = typedValue;
                }
            }

            return TRUE;
        }